

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznoderep.h
# Opt level: O2

int __thiscall
pzgeom::TPZNodeRep<2,_pztopology::TPZLine>::ClassId(TPZNodeRep<2,_pztopology::TPZLine> *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"TPZNodeRep",&local_31);
  uVar1 = Hash(&local_30);
  iVar2 = pztopology::TPZLine::ClassId(&this->super_TPZLine);
  std::__cxx11::string::~string((string *)&local_30);
  return uVar1 ^ iVar2 * 2 ^ 8;
}

Assistant:

int TPZNodeRep<N, Topology>::ClassId() const{
        return Hash("TPZNodeRep") ^ Topology::ClassId() << 1 ^ (N << 2);
    }